

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.cpp
# Opt level: O3

optional<Storage::Tape::ZXSpectrum::Block> __thiscall
Storage::Tape::ZXSpectrum::Parser::find_block(Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  optional<unsigned_char> oVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  
  if (this->machine_type_ != ZXSpectrum) {
    this->speed_phase_ = WaitingForGap;
  }
  Parser<Storage::Tape::ZXSpectrum::SymbolType>::proceed_to_symbol
            ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,tape,Pilot);
  iVar3 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_Tape)();
  if (((char)iVar3 == '\0') ||
     (((this->
       super_PulseClassificationParser<Storage::Tape::ZXSpectrum::WaveType,_Storage::Tape::ZXSpectrum::SymbolType>
       ).super_Parser<Storage::Tape::ZXSpectrum::SymbolType>.has_next_symbol_ & 1U) != 0)) {
    uVar4 = 0;
    Parser<Storage::Tape::ZXSpectrum::SymbolType>::proceed_to_symbol
              ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,tape,Zero);
    iVar3 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->_vptr_Tape)();
    if (((char)iVar3 == '\0') ||
       (uVar2 = 0,
       ((this->
        super_PulseClassificationParser<Storage::Tape::ZXSpectrum::WaveType,_Storage::Tape::ZXSpectrum::SymbolType>
        ).super_Parser<Storage::Tape::ZXSpectrum::SymbolType>.has_next_symbol_ & 1U) != 0)) {
      oVar1 = get_byte(this,tape);
      uVar4 = (ushort)oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_char> & 0xff;
      uVar2 = (ushort)oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_char> & 0x100;
    }
  }
  else {
    uVar4 = 0;
    uVar2 = 0;
  }
  return (_Optional_base<Storage::Tape::ZXSpectrum::Block,_true,_true>)
         (_Optional_base<Storage::Tape::ZXSpectrum::Block,_true,_true>)(uVar2 | uVar4);
}

Assistant:

std::optional<Block> Parser::find_block(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	// Decide whether to kick off a speed detection phase.
	if(should_detect_speed()) {
		speed_phase_ = SpeedDetectionPhase::WaitingForGap;
	}

	// Find pilot tone.
	proceed_to_symbol(tape, SymbolType::Pilot);
	if(is_at_end(tape)) return std::nullopt;

	// Find sync bit.
	proceed_to_symbol(tape, SymbolType::Zero);
	if(is_at_end(tape)) return std::nullopt;

	// Read marker byte.
	const auto type = get_byte(tape);
	if(!type) return std::nullopt;

	// That succeeded.
	Block block = {
		.type = *type
	};
	return block;
}